

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O2

int gost_ec_point_mul(EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  
  if (ctx == (BN_CTX *)0x0 || (r == (EC_POINT *)0x0 || group == (EC_GROUP *)0x0)) {
    return 0;
  }
  if (n == (BIGNUM *)0x0 || m == (BIGNUM *)0x0) {
    if (n == (BIGNUM *)0x0) {
      if (q == (EC_POINT *)0x0 || m == (BIGNUM *)0x0) {
        return 0;
      }
      iVar1 = EC_GROUP_get_curve_name((EC_GROUP *)group);
      switch(iVar1) {
      case 0x347:
        iVar1 = point_mul_id_GostR3410_2001_TestParamSet(group,r,q,m,ctx);
        return iVar1;
      case 0x348:
      case 0x34b:
        goto switchD_0011d96c_caseD_348;
      case 0x349:
switchD_0011d96c_caseD_349:
        iVar1 = point_mul_id_GostR3410_2001_CryptoPro_B_ParamSet(group,r,q,m,ctx);
        return iVar1;
      case 0x34a:
      case 0x34c:
switchD_0011d96c_caseD_34a:
        iVar1 = point_mul_id_GostR3410_2001_CryptoPro_C_ParamSet(group,r,q,m,ctx);
        return iVar1;
      default:
        if (iVar1 == 0x3e6) {
          iVar1 = point_mul_id_tc26_gost_3410_2012_512_paramSetA(group,r,q,m,ctx);
          return iVar1;
        }
        if (iVar1 == 999) {
          iVar1 = point_mul_id_tc26_gost_3410_2012_512_paramSetB(group,r,q,m,ctx);
          return iVar1;
        }
        if (iVar1 == 0x47c) {
          iVar1 = point_mul_id_tc26_gost_3410_2012_256_paramSetA(group,r,q,m,ctx);
          return iVar1;
        }
        if (iVar1 == 0x47d) {
          iVar1 = point_mul_id_tc26_gost_3410_2012_512_paramSetC(group,r,q,m,ctx);
          return iVar1;
        }
        if (iVar1 == 0x4a2) goto switchD_0011d96c_caseD_34a;
        if (iVar1 == 0x4a1) goto switchD_0011d96c_caseD_349;
        if (iVar1 != 0x4a0) {
          n = (BIGNUM *)0x0;
          goto LAB_0011d7d1;
        }
switchD_0011d96c_caseD_348:
        iVar1 = point_mul_id_GostR3410_2001_CryptoPro_A_ParamSet(group,r,q,m,ctx);
        return iVar1;
      }
    }
    iVar1 = EC_GROUP_get_curve_name((EC_GROUP *)group);
    switch(iVar1) {
    case 0x347:
      iVar1 = point_mul_g_id_GostR3410_2001_TestParamSet(group,r,n,ctx);
      return iVar1;
    case 0x348:
    case 0x34b:
      goto switchD_0011d8b5_caseD_348;
    case 0x349:
switchD_0011d8b5_caseD_349:
      iVar1 = point_mul_g_id_GostR3410_2001_CryptoPro_B_ParamSet(group,r,n,ctx);
      return iVar1;
    case 0x34a:
    case 0x34c:
switchD_0011d8b5_caseD_34a:
      iVar1 = point_mul_g_id_GostR3410_2001_CryptoPro_C_ParamSet(group,r,n,ctx);
      return iVar1;
    default:
      if (iVar1 == 0x3e6) {
        iVar1 = point_mul_g_id_tc26_gost_3410_2012_512_paramSetA(group,r,n,ctx);
        return iVar1;
      }
      if (iVar1 == 999) {
        iVar1 = point_mul_g_id_tc26_gost_3410_2012_512_paramSetB(group,r,n,ctx);
        return iVar1;
      }
      if (iVar1 == 0x47c) {
        iVar1 = point_mul_g_id_tc26_gost_3410_2012_256_paramSetA(group,r,n,ctx);
        return iVar1;
      }
      if (iVar1 == 0x47d) {
        iVar1 = point_mul_g_id_tc26_gost_3410_2012_512_paramSetC(group,r,n,ctx);
        return iVar1;
      }
      if (iVar1 == 0x4a2) goto switchD_0011d8b5_caseD_34a;
      if (iVar1 == 0x4a1) goto switchD_0011d8b5_caseD_349;
      if (iVar1 != 0x4a0) {
LAB_0011d7d1:
        iVar1 = EC_POINT_mul((EC_GROUP *)group,(EC_POINT *)r,(BIGNUM *)n,(EC_POINT *)q,(BIGNUM *)m,
                             (BN_CTX *)ctx);
        return iVar1;
      }
switchD_0011d8b5_caseD_348:
      iVar1 = point_mul_g_id_GostR3410_2001_CryptoPro_A_ParamSet(group,r,n,ctx);
      return iVar1;
    }
  }
  if (q == (EC_POINT *)0x0) {
    return 0;
  }
  iVar1 = EC_GROUP_get_curve_name((EC_GROUP *)group);
  switch(iVar1) {
  case 0x347:
    iVar1 = point_mul_two_id_GostR3410_2001_TestParamSet(group,r,n,q,m,ctx);
    return iVar1;
  case 0x348:
  case 0x34b:
    goto switchD_0011d880_caseD_348;
  case 0x349:
switchD_0011d880_caseD_349:
    iVar1 = point_mul_two_id_GostR3410_2001_CryptoPro_B_ParamSet(group,r,n,q,m,ctx);
    return iVar1;
  case 0x34a:
  case 0x34c:
switchD_0011d880_caseD_34a:
    iVar1 = point_mul_two_id_GostR3410_2001_CryptoPro_C_ParamSet(group,r,n,q,m,ctx);
    return iVar1;
  default:
    if (iVar1 == 0x3e6) {
      iVar1 = point_mul_two_id_tc26_gost_3410_2012_512_paramSetA(group,r,n,q,m,ctx);
      return iVar1;
    }
    if (iVar1 == 999) {
      iVar1 = point_mul_two_id_tc26_gost_3410_2012_512_paramSetB(group,r,n,q,m,ctx);
      return iVar1;
    }
    if (iVar1 == 0x47c) {
      iVar1 = point_mul_two_id_tc26_gost_3410_2012_256_paramSetA(group,r,n,q,m,ctx);
      return iVar1;
    }
    if (iVar1 == 0x47d) {
      iVar1 = point_mul_two_id_tc26_gost_3410_2012_512_paramSetC(group,r,n,q,m,ctx);
      return iVar1;
    }
    if (iVar1 == 0x4a2) goto switchD_0011d880_caseD_34a;
    if (iVar1 == 0x4a1) goto switchD_0011d880_caseD_349;
    if (iVar1 != 0x4a0) goto LAB_0011d7d1;
switchD_0011d880_caseD_348:
    iVar1 = point_mul_two_id_GostR3410_2001_CryptoPro_A_ParamSet(group,r,n,q,m,ctx);
    return iVar1;
  }
}

Assistant:

int gost_ec_point_mul(const EC_GROUP *group, EC_POINT *r, const BIGNUM *n,
                      const EC_POINT *q, const BIGNUM *m, BN_CTX *ctx)
{
    if (group == NULL || r == NULL || ctx == NULL)
        return 0;

    if (m != NULL && n != NULL) {
        /* verification */
        if (q == NULL)
            return 0;
        switch(EC_GROUP_get_curve_name(group)) {
            case NID_id_GostR3410_2001_CryptoPro_A_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetB:
                return point_mul_two_id_GostR3410_2001_CryptoPro_A_ParamSet(group, r, n, q, m, ctx);
            case NID_id_GostR3410_2001_CryptoPro_B_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetC:
                return point_mul_two_id_GostR3410_2001_CryptoPro_B_ParamSet(group, r, n, q, m, ctx);
            case NID_id_GostR3410_2001_CryptoPro_C_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetD:
                return point_mul_two_id_GostR3410_2001_CryptoPro_C_ParamSet(group, r, n, q, m, ctx);
            case NID_id_GostR3410_2001_TestParamSet:
                return point_mul_two_id_GostR3410_2001_TestParamSet(group, r, n, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_256_paramSetA:
                return point_mul_two_id_tc26_gost_3410_2012_256_paramSetA(group, r, n, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetA:
                return point_mul_two_id_tc26_gost_3410_2012_512_paramSetA(group, r, n, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetB:
                return point_mul_two_id_tc26_gost_3410_2012_512_paramSetB(group, r, n, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetC:
                return point_mul_two_id_tc26_gost_3410_2012_512_paramSetC(group, r, n, q, m, ctx);
            default:
                return EC_POINT_mul(group, r, n, q, m, ctx);
        }
    } else if (n != NULL) {
        /* mul g */
        switch(EC_GROUP_get_curve_name(group)) {
            case NID_id_GostR3410_2001_CryptoPro_A_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetB:
                return point_mul_g_id_GostR3410_2001_CryptoPro_A_ParamSet(group, r, n, ctx);
            case NID_id_GostR3410_2001_CryptoPro_B_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetC:
                return point_mul_g_id_GostR3410_2001_CryptoPro_B_ParamSet(group, r, n, ctx);
            case NID_id_GostR3410_2001_CryptoPro_C_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetD:
                return point_mul_g_id_GostR3410_2001_CryptoPro_C_ParamSet(group, r, n, ctx);
            case NID_id_GostR3410_2001_TestParamSet:
                return point_mul_g_id_GostR3410_2001_TestParamSet(group, r, n, ctx);
            case NID_id_tc26_gost_3410_2012_256_paramSetA:
                return point_mul_g_id_tc26_gost_3410_2012_256_paramSetA(group, r, n, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetA:
                return point_mul_g_id_tc26_gost_3410_2012_512_paramSetA(group, r, n, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetB:
                return point_mul_g_id_tc26_gost_3410_2012_512_paramSetB(group, r, n, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetC:
                return point_mul_g_id_tc26_gost_3410_2012_512_paramSetC(group, r, n, ctx);
            default:
                return EC_POINT_mul(group, r, n, q, m, ctx);
        }
    } else if (m != NULL) {
        if (q == NULL)
            return 0;
        /* mul */
        switch(EC_GROUP_get_curve_name(group)) {
            case NID_id_GostR3410_2001_CryptoPro_A_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetB:
                return point_mul_id_GostR3410_2001_CryptoPro_A_ParamSet(group, r, q, m, ctx);
            case NID_id_GostR3410_2001_CryptoPro_B_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetC:
                return point_mul_id_GostR3410_2001_CryptoPro_B_ParamSet(group, r, q, m, ctx);
            case NID_id_GostR3410_2001_CryptoPro_C_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetD:
                return point_mul_id_GostR3410_2001_CryptoPro_C_ParamSet(group, r, q, m, ctx);
            case NID_id_GostR3410_2001_TestParamSet:
                return point_mul_id_GostR3410_2001_TestParamSet(group, r, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_256_paramSetA:
                return point_mul_id_tc26_gost_3410_2012_256_paramSetA(group, r, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetA:
                return point_mul_id_tc26_gost_3410_2012_512_paramSetA(group, r, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetB:
                return point_mul_id_tc26_gost_3410_2012_512_paramSetB(group, r, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetC:
                return point_mul_id_tc26_gost_3410_2012_512_paramSetC(group, r, q, m, ctx);
            default:
                return EC_POINT_mul(group, r, n, q, m, ctx);
        }
    }
    return 0;
}